

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameParseSql(Parse *p,char *zDb,sqlite3 *db,char *zSql,int bTemp)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  
  sqlite3ParseObjectInit(p,db);
  if (zSql == (char *)0x0) {
    iVar2 = 7;
  }
  else {
    iVar2 = sqlite3_strnicmp(zSql,"CREATE ",7);
    if (iVar2 != 0) {
      iVar2 = sqlite3CorruptError(0x1b274);
      return iVar2;
    }
    uVar1 = '\x01';
    if (bTemp == 0) {
      iVar2 = sqlite3FindDbName(db,zDb);
      uVar1 = (u8)iVar2;
    }
    (db->init).iDb = uVar1;
    p->eParseMode = '\x02';
    p->db = db;
    p->nQueryLoop = 1;
    iVar3 = sqlite3RunParser(p,zSql);
    iVar2 = 7;
    if (db->mallocFailed == '\0') {
      iVar2 = iVar3;
    }
    if ((((iVar2 == 0) && (iVar2 = 0, p->pNewTable == (Table *)0x0)) &&
        (p->pNewIndex == (Index *)0x0)) && (p->pNewTrigger == (Trigger *)0x0)) {
      iVar2 = sqlite3CorruptError(0x1b27f);
    }
    (db->init).iDb = '\0';
  }
  return iVar2;
}

Assistant:

static int renameParseSql(
  Parse *p,                       /* Memory to use for Parse object */
  const char *zDb,                /* Name of schema SQL belongs to */
  sqlite3 *db,                    /* Database handle */
  const char *zSql,               /* SQL to parse */
  int bTemp                       /* True if SQL is from temp schema */
){
  int rc;

  sqlite3ParseObjectInit(p, db);
  if( zSql==0 ){
    return SQLITE_NOMEM;
  }
  if( sqlite3StrNICmp(zSql,"CREATE ",7)!=0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  db->init.iDb = bTemp ? 1 : sqlite3FindDbName(db, zDb);
  p->eParseMode = PARSE_MODE_RENAME;
  p->db = db;
  p->nQueryLoop = 1;
  rc = sqlite3RunParser(p, zSql);
  if( db->mallocFailed ) rc = SQLITE_NOMEM;
  if( rc==SQLITE_OK
   && NEVER(p->pNewTable==0 && p->pNewIndex==0 && p->pNewTrigger==0)
  ){
    rc = SQLITE_CORRUPT_BKPT;
  }

#ifdef SQLITE_DEBUG
  /* Ensure that all mappings in the Parse.pRename list really do map to
  ** a part of the input string.  */
  if( rc==SQLITE_OK ){
    int nSql = sqlite3Strlen30(zSql);
    RenameToken *pToken;
    for(pToken=p->pRename; pToken; pToken=pToken->pNext){
      assert( pToken->t.z>=zSql && &pToken->t.z[pToken->t.n]<=&zSql[nSql] );
    }
  }
#endif

  db->init.iDb = 0;
  return rc;
}